

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppunfix5.h
# Opt level: O3

void __thiscall pointprocess::poissonprocess(pointprocess *this,double intensity)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = 1.0;
  if (0 < (long)this->k) {
    lVar2 = 0;
    do {
      dVar5 = dVar5 * this->akse[lVar2];
      lVar2 = lVar2 + 1;
    } while (this->k != lVar2);
  }
  dVar3 = drand48();
  dVar4 = exp(-(dVar5 * intensity));
  iVar1 = 0;
  if (dVar4 <= dVar3) {
    iVar1 = 0;
    dVar6 = dVar4;
    do {
      iVar1 = iVar1 + 1;
      dVar4 = dVar4 * ((dVar5 * intensity) / (double)iVar1);
      dVar6 = dVar6 + dVar4;
    } while (dVar6 <= dVar3);
  }
  this->n = iVar1;
  binoprocess(this);
  return;
}

Assistant:

void pointprocess :: poissonprocess ( double intensity )
{
  double areaS = 1;
  int i;
  for ( i = 0; i < k; i++ )
    areaS *= akse[i];         // AREA/VOLUME OF OBSERVATION WINDOW S

  n = poisson(intensity*areaS); // ANT PKTER ER POISSON FORDELT
  binoprocess();
}